

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * Catch::getFormattedDuration_abi_cxx11_(double duration)

{
  string *in_RDI;
  undefined8 in_XMM0_Qa;
  ErrnoGuard guard;
  char buffer [314];
  size_t maxDoubleSize;
  string *this;
  allocator local_15d [5];
  char local_158 [320];
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = 0x13a;
  this = in_RDI;
  local_10 = in_XMM0_Qa;
  ErrnoGuard::ErrnoGuard((ErrnoGuard *)in_RDI);
  sprintf(local_158,"%.3f",local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,local_158,local_15d);
  std::allocator<char>::~allocator((allocator<char> *)local_15d);
  ErrnoGuard::~ErrnoGuard((ErrnoGuard *)this);
  return this;
}

Assistant:

std::string getFormattedDuration( double duration ) {
        // Max exponent + 1 is required to represent the whole part
        // + 1 for decimal point
        // + 3 for the 3 decimal places
        // + 1 for null terminator
        const std::size_t maxDoubleSize = DBL_MAX_10_EXP + 1 + 1 + 3 + 1;
        char buffer[maxDoubleSize];

        // Save previous errno, to prevent sprintf from overwriting it
        ErrnoGuard guard;
#ifdef _MSC_VER
        sprintf_s(buffer, "%.3f", duration);
#else
        std::sprintf(buffer, "%.3f", duration);
#endif
        return std::string(buffer);
    }